

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_field_sample_generated.h
# Opt level: O2

void __thiscall
keyfield::sample::Grain::Grain(Grain *this,span<const_keyfield::sample::Rice,_3UL> *_a,uint8_t _tag)

{
  span<const_keyfield::sample::Rice,_3UL> local_10;
  
  this->a_[2].origin_[0] = '\0';
  this->a_[2].origin_[1] = '\0';
  this->a_[2].origin_[2] = '\0';
  this->a_[2].padding0__ = '\0';
  this->a_[2].quantity_ = 0;
  this->a_[0].origin_[0] = '\0';
  this->a_[0].origin_[1] = '\0';
  this->a_[0].origin_[2] = '\0';
  this->a_[0].padding0__ = '\0';
  this->a_[0].quantity_ = 0;
  this->a_[1].origin_[0] = '\0';
  this->a_[1].origin_[1] = '\0';
  this->a_[1].origin_[2] = '\0';
  this->a_[1].padding0__ = '\0';
  this->a_[1].quantity_ = 0;
  this->tag_ = _tag;
  this->padding0__ = '\0';
  this->padding1__ = 0;
  local_10.data_ = _a->data_;
  local_10.count_ = _a->count_;
  flatbuffers::Array<keyfield::sample::Rice,_(unsigned_short)3>::CopyFromSpan
            ((Array<keyfield::sample::Rice,_(unsigned_short)3> *)this,&local_10);
  return;
}

Assistant:

Grain(::flatbuffers::span<const keyfield::sample::Rice, 3> _a, uint8_t _tag)
      : tag_(::flatbuffers::EndianScalar(_tag)),
        padding0__(0),
        padding1__(0) {
    ::flatbuffers::CastToArray(a_).CopyFromSpan(_a);
    (void)padding0__;
    (void)padding1__;
  }